

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(cmCTestCoverageHandlerLocale *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  if ((this->lc_all)._M_string_length == 0) {
    cmSystemTools::UnsetEnv("LC_ALL");
  }
  else {
    std::operator+(&bStack_28,"LC_ALL=",&this->lc_all);
    cmsys::SystemTools::PutEnv(&bStack_28);
    std::__cxx11::string::~string((string *)&bStack_28);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~cmCTestCoverageHandlerLocale()
  {
    if (!this->lc_all.empty()) {
      cmSystemTools::PutEnv("LC_ALL=" + this->lc_all);
    } else {
      cmSystemTools::UnsetEnv("LC_ALL");
    }
  }